

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_range_closed_64(void **param_1)

{
  ulong uVar1;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  bool bVar2;
  reference ppVar3;
  uint64_t v_1;
  Roaring64Map r2_1;
  Roaring64Map r1_1;
  uint64_t max;
  uint64_t min;
  pair<unsigned_long,_unsigned_long> *range;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  uint64_t b1;
  uint32_t v;
  Roaring64Map r2;
  Roaring64Map r1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffdf8;
  Roaring64Map *in_stack_fffffffffffffe00;
  Roaring64Map *this;
  char *in_stack_fffffffffffffe08;
  char *expression;
  Roaring64Map *this_00;
  ulong local_1e8;
  allocator_type *in_stack_fffffffffffffe28;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffe30;
  iterator in_stack_fffffffffffffe38;
  Roaring64Map *in_stack_fffffffffffffe40;
  Roaring64Map *in_stack_fffffffffffffe48;
  uint64_t in_stack_fffffffffffffe50;
  pointer in_stack_fffffffffffffe58;
  Roaring64Map *in_stack_fffffffffffffe60;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_150;
  undefined1 *local_148;
  char local_139;
  unsigned_long local_138;
  unsigned_long local_130;
  unsigned_long local_128;
  unsigned_long local_120;
  unsigned_long local_118;
  unsigned_long local_110;
  unsigned_long local_108;
  undefined1 local_100 [32];
  pair<unsigned_long,_unsigned_long> local_e0;
  pair<unsigned_long,_unsigned_long> local_d0;
  Roaring64Map *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  unsigned_long local_98;
  uint local_8c;
  Roaring64Map local_40;
  
  this_00 = &local_40;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffe00);
  roaring::Roaring64Map::addRangeClosed
            (in_stack_fffffffffffffe00,(uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffdf8);
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffe00);
  for (local_8c = 1; local_8c < 6; local_8c = local_8c + 1) {
    roaring::Roaring64Map::add
              (in_stack_fffffffffffffe00,(uint32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  }
  roaring::Roaring64Map::operator==(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  _assert_true((unsigned_long)this_00,in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1098a4);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1098b1);
  local_98 = 0x100000000;
  local_108 = 0x10000000a;
  this = (Roaring64Map *)local_100;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)this,&local_98,&local_108);
  local_110 = local_98 + 100;
  local_118 = local_98 + 100;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(local_100 + 0x10),&local_110,&local_118);
  local_120 = local_98 - 10;
  local_128 = local_98 + 10;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&local_e0,&local_120,&local_128);
  local_130 = local_98 + 2;
  local_138 = local_98 - 2;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&local_d0,&local_130,&local_138);
  local_b8 = 4;
  expression = &local_139;
  local_c0 = this;
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x1099f3);
  __l._M_len = (size_type)in_stack_fffffffffffffe40;
  __l._M_array = in_stack_fffffffffffffe38;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(in_stack_fffffffffffffe30,__l,in_stack_fffffffffffffe28);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x109a24);
  local_148 = local_b0;
  local_150._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin(in_stack_fffffffffffffdf8);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::end(in_stack_fffffffffffffdf8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)this,(__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffdf8);
    if (!bVar2) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(&local_150);
    local_1e8 = ppVar3->first;
    uVar1 = ppVar3->second;
    in_stack_fffffffffffffdf8 =
         (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *)&stack0xfffffffffffffe58;
    roaring::Roaring64Map::Roaring64Map(this);
    roaring::Roaring64Map::addRangeClosed
              (in_stack_fffffffffffffe60,(uint64_t)in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50);
    roaring::Roaring64Map::Roaring64Map(this);
    for (; local_1e8 <= uVar1; local_1e8 = local_1e8 + 1) {
      roaring::Roaring64Map::add(this_00,(uint64_t)expression);
    }
    roaring::Roaring64Map::operator==(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    _assert_true((unsigned_long)this_00,expression,(char *)this,
                 (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x109bd4);
    roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x109bde);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&local_150);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)this_00);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range_closed_64) {
    {
        // 32-bit integers
        Roaring64Map r1;
        r1.addRangeClosed(uint32_t(1), uint32_t(5));
        Roaring64Map r2;
        for (uint32_t v = 1; v <= 5; ++v) {
            r2.add(v);
        }
        assert_true(r1 == r2);
    }
    auto b1 = uint64_t(1) << 32;
    std::vector<std::pair<uint64_t, uint64_t>> ranges = {
        {b1, b1 + 10},
        {b1 + 100, b1 + 100},  // one element
        {b1 - 10, b1 + 10},
        {b1 + 2, b1 - 2}};
    for (const auto &range : ranges) {
        uint64_t min = range.first;
        uint64_t max = range.second;
        Roaring64Map r1;
        r1.addRangeClosed(min, max);
        Roaring64Map r2;
        for (uint64_t v = min; v <= max; ++v) {
            r2.add(v);
        }
        assert_true(r1 == r2);
    }
}